

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Char * poolCopyStringN(STRING_POOL *pool,XML_Char *s,int n)

{
  XML_Char XVar1;
  XML_Char *pXVar2;
  int iVar3;
  int local_24;
  XML_Char *pXStack_20;
  int n_local;
  XML_Char *s_local;
  STRING_POOL *pool_local;
  
  local_24 = n;
  pXStack_20 = s;
  if ((pool->ptr == (XML_Char *)0x0) && (iVar3 = poolGrow(pool), iVar3 == 0)) {
    pool_local = (STRING_POOL *)0x0;
  }
  else {
    for (; 0 < local_24; local_24 = local_24 + -1) {
      if ((pool->ptr == pool->end) && (iVar3 = poolGrow(pool), iVar3 == 0)) {
        return (XML_Char *)0x0;
      }
      XVar1 = *pXStack_20;
      pXVar2 = pool->ptr;
      pool->ptr = pXVar2 + 1;
      *pXVar2 = XVar1;
      pXStack_20 = pXStack_20 + 1;
    }
    pool_local = (STRING_POOL *)pool->start;
    pool->start = pool->ptr;
  }
  return (XML_Char *)pool_local;
}

Assistant:

static const XML_Char *poolCopyStringN(STRING_POOL *pool, const XML_Char *s, int n)
{
  if (!pool->ptr && !poolGrow(pool))
    return 0;
  for (; n > 0; --n, s++) {
    if (!poolAppendChar(pool, *s))
      return 0;

  }
  s = pool->start;
  poolFinish(pool);
  return s;
}